

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.hpp
# Opt level: O0

void __thiscall Centaurus::SimpleException::SimpleException(SimpleException *this,string *msg)

{
  string *msg_local;
  SimpleException *this_local;
  
  std::exception::exception(&this->super_exception);
  *(undefined ***)this = &PTR__SimpleException_0028b420;
  std::__cxx11::string::string((string *)&this->m_msg,(string *)msg);
  return;
}

Assistant:

SimpleException(const std::string& msg) noexcept
        : m_msg(msg)
    {
    }